

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O0

int fy_fetch_value(fy_parser *fyp,int c)

{
  bool bVar1;
  bool bVar2;
  _Bool _Var3;
  ushort uVar4;
  fy_atom *pfVar5;
  fy_atom *pfVar6;
  fy_atom *pfVar7;
  char *pcVar8;
  undefined1 local_1c8 [8];
  undefined8 local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  fy_input *local_1a0;
  char *local_198;
  undefined8 uStack_190;
  fy_parser *local_188;
  uint local_17c;
  fy_parser *local_178;
  byte local_16d;
  byte local_16c;
  bool local_16b;
  bool local_16a;
  bool local_169;
  undefined1 auStack_168 [8];
  fy_diag_report_ctx _drc_2;
  undefined1 auStack_138 [8];
  fy_diag_report_ctx _drc_1;
  undefined1 auStack_108 [8];
  fy_diag_report_ctx _drc;
  _Bool local_d6;
  byte local_d5;
  int rc;
  _Bool is_multiline;
  _Bool final_complex_key;
  _Bool did_purge;
  _Bool push_key_only;
  _Bool push_bmap_start;
  _Bool has_bmap;
  _Bool is_complex;
  _Bool target_simple_key_allowed;
  fy_atom handle;
  fy_token *fyt;
  fy_token *fyt_insert;
  fy_mark mark_end_insert;
  fy_mark mark_insert;
  fy_mark mark;
  fy_simple_key *fysk;
  fy_token_list sk_tl;
  int c_local;
  fy_parser *fyp_local;
  
  pfVar6 = (fy_atom *)&local_188;
  pfVar5 = (fy_atom *)&local_188;
  mark.line = 0;
  mark.column = 0;
  sk_tl._lh.prev._4_4_ = c;
  if (c == 0x3a) {
    uStack_190 = 0x143393;
    _Var3 = fyp_json_mode(fyp);
    if ((_Var3) && (fyp->flow != FYFT_MAP)) {
      _drc.fyt = (fy_token *)0x0;
      _drc.has_override = false;
      _drc._17_7_ = 0;
      _drc.type = FYET_DEBUG;
      _drc.module = FYEM_UNKNOWN;
      _drc.override_file = (char *)0x0;
      auStack_108._0_4_ = FYET_ERROR;
      auStack_108._4_4_ = FYEM_SCAN;
      pfVar6 = (fy_atom *)local_1c8;
      pfVar5 = fy_fill_atom_at(fyp,0,1,pfVar6);
      _drc._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar5);
      fy_parser_diag_report
                (fyp,(fy_diag_report_ctx *)auStack_108,
                 "JSON considers keys when not in mapping context invalid");
    }
    else {
      uStack_190 = 0x14343c;
      fy_get_mark(fyp,(fy_mark *)&mark_insert.line);
      uStack_190 = 0x143445;
      fy_token_list_init((fy_token_list *)&fysk);
      if ((fyp->flow_level == 0) || (fyp->indent < fyp->column)) {
        uStack_190 = 0x143501;
        _drc.override_column = fy_purge_stale_simple_keys(fyp,&local_d6,FYTT_VALUE);
        if (_drc.override_column != 0) {
          uStack_190 = 0x14353a;
          fy_parser_diag(fyp,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                         ,0x7e3,"fy_fetch_value","fy_purge_stale_simple_keys() failed");
          pfVar5 = (fy_atom *)&local_188;
          goto LAB_00143f9d;
        }
        uStack_190 = 0x143551;
        mark._8_8_ = fy_simple_key_list_head(&fyp->simple_keys);
        if (((fy_simple_key *)mark._8_8_ == (fy_simple_key *)0x0) ||
           (((fy_simple_key *)mark._8_8_)->flow_level != fyp->flow_level)) {
          mark.line = 0;
          mark.column = 0;
        }
        else {
          uStack_190 = 0x143580;
          fy_simple_key_list_del(&fyp->simple_keys,(fy_simple_key *)mark._8_8_);
        }
        if (mark._8_8_ == 0) {
          local_198 = (char *)CONCAT44(local_198._4_4_,fyp->flow_level);
          local_1a0 = (fy_input *)0x1435c9;
          fy_parser_diag(fyp,0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                         ,0x7ed,"fy_fetch_value","no simple key flow_level=%d");
          uStack_190 = 0x1435dd;
          fyt = fy_token_list_tail(&fyp->queued_tokens);
          mark_end_insert.line = mark_insert.line;
          mark_end_insert.column = mark_insert.column;
          mark_insert.input_pos = mark.input_pos;
          mark_end_insert.input_pos = mark.input_pos;
        }
        else {
          if ((*(byte *)(mark._8_8_ + 0x3c) >> 1 & 1) == 0) {
            uStack_190 = 0x143639;
            __assert_fail("fysk->possible",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                          ,0x7f3,"int fy_fetch_value(struct fy_parser *, int)");
          }
          if (*(int *)(mark._8_8_ + 0x38) != fyp->flow_level) {
            uStack_190 = 0x14366a;
            __assert_fail("fysk->flow_level == fyp->flow_level",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                          ,0x7f4,"int fy_fetch_value(struct fy_parser *, int)");
          }
          fyt = *(fy_token **)(mark._8_8_ + 0x30);
          mark_end_insert._8_8_ = *(undefined8 *)(mark._8_8_ + 0x10);
          mark_insert.input_pos = *(size_t *)(mark._8_8_ + 0x18);
          mark_end_insert.input_pos = *(size_t *)(mark._8_8_ + 0x28);
          local_198 = (char *)CONCAT44(local_198._4_4_,fyp->flow_level);
          local_1a0 = (fy_input *)0x1436d9;
          fy_parser_diag(fyp,0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                         ,0x7f9,"fy_fetch_value","have simple key flow_level=%d");
        }
        local_1a8._0_4_ = fyp->flow_level;
        local_1a0._0_4_ = mark_insert.input_pos._4_4_;
        local_1b0 = (char *)0x14372e;
        local_198._0_4_ = fyp->indent;
        fy_parser_diag(fyp,0x20,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                       ,0x7fd,"fy_fetch_value","flow_level=%d, column=%d parse_indent=%d");
        rc._2_1_ = -1 < fyp->pending_complex_key_column;
        local_169 = false;
        if ((bool)rc._2_1_) {
          local_16a = true;
          if (fyp->flow_level == 0) {
            local_16a = fyp->column <= (fyp->pending_complex_key_mark).column;
          }
          local_169 = local_16a;
        }
        bVar2 = local_169;
        bVar1 = (int)mark_end_insert.input_pos < fyp->line;
        uVar4 = *(ushort *)&fyp->field_0x70 >> 5;
        rc._1_1_ = (byte)uVar4 & 1;
        local_16b = false;
        if (fyp->flow_level == 0) {
          local_16b = fyp->indent < mark_insert.input_pos._4_4_;
        }
        rc._0_1_ = local_16b;
        if (((bool)rc._2_1_) ||
           ((local_16c = 1, fyp->flow_level == 0 && (local_16c = 1, (uVar4 & 1) == 0)))) {
          local_16d = 0;
          if ((bool)rc._2_1_) {
            local_16d = local_169 ^ 0xff;
          }
          local_16c = local_16d;
        }
        local_d5 = local_16c & 1;
        local_1b8 = (char *)CONCAT44(local_1b8._4_4_,(undefined4)mark_insert.input_pos);
        local_1b0 = (char *)CONCAT44(local_1b0._4_4_,mark_insert.input_pos._4_4_);
        local_1a8 = (char *)CONCAT44(local_1a8._4_4_,(int)mark_end_insert.input_pos);
        local_1a0 = (fy_input *)CONCAT44(local_1a0._4_4_,mark_end_insert.input_pos._4_4_);
        local_198 = (char *)CONCAT44(local_198._4_4_,fyp->line);
        local_1c0._0_4_ = 0x1438be;
        local_1c0._4_4_ = 0;
        fy_parser_diag(fyp,0x20,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                       ,0x80a,"fy_fetch_value",
                       "mark_insert.line=%d/%d mark_end_insert.line=%d/%d fyp->line=%d");
        local_1c8 = (undefined1  [8])0x17d3ef;
        if ((*(ushort *)&fyp->field_0x70 >> 3 & 1) != 0) {
          local_1c8 = (undefined1  [8])0x17bd4a;
        }
        local_1c0 = "false";
        if ((rc._2_1_ & 1) != 0) {
          local_1c0 = "true";
        }
        local_1b8 = "false";
        if (bVar2 != false) {
          local_1b8 = "true";
        }
        local_1b0 = "false";
        if (bVar1) {
          local_1b0 = "true";
        }
        local_1a8 = "false";
        if ((rc._1_1_ & 1) != 0) {
          local_1a8 = "true";
        }
        local_1a0 = (fy_input *)0x17d3ef;
        if (((byte)rc & 1) != 0) {
          local_1a0 = (fy_input *)0x17bd4a;
        }
        local_198 = "false";
        if ((local_d5 & 1) != 0) {
          local_198 = "true";
        }
        pfVar6 = (fy_atom *)local_1c8;
        fy_parser_diag(fyp,0x20,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                       ,0x814,"fy_fetch_value",
                       "simple_key_allowed=%s is_complex=%s final_complex_key=%s is_multiline=%s has_bmap=%s push_bmap_start=%s push_key_only=%s"
                      );
        if ((((rc._2_1_ & 1) != 0) || (!bVar1)) ||
           ((fyp->flow_level != 0 && (fyp->flow == FYFT_MAP)))) {
          if (((byte)rc & 1) != 0) {
            if (fyp->flow_level != 0) {
              uStack_190 = 0x143acc;
              __assert_fail("!fyp->flow_level",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                            ,0x81d,"int fy_fetch_value(struct fy_parser *, int)");
            }
            uStack_190 = 0x143af6;
            fy_parser_diag(fyp,0x20,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                           ,0x81f,"fy_fetch_value","--- parse_roll");
            uStack_190 = 0x143b07;
            _drc.override_column = fy_push_indent(fyp,mark_insert.input_pos._4_4_,true);
            if (_drc.override_column != 0) {
              uStack_190 = 0x143b40;
              fy_parser_diag(fyp,4,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                             ,0x824,"fy_fetch_value","fy_push_indent() failed");
              pfVar5 = (fy_atom *)&local_188;
              goto LAB_00143f9d;
            }
            uStack_190 = 0x143b57;
            fy_fill_atom_start(fyp,(fy_atom *)&is_multiline);
            uStack_190 = 0x143b67;
            fy_fill_atom_end(fyp,(fy_atom *)&is_multiline);
            handle.start_mark.line = mark_end_insert.line;
            handle.start_mark.column = mark_end_insert.column;
            handle.end_mark.input_pos = mark_insert.input_pos;
            _is_multiline = mark_end_insert.line;
            _push_bmap_start = mark_end_insert.column;
            handle.start_mark.input_pos = mark_insert.input_pos;
            uStack_190 = 0x143bb4;
            handle._48_8_ =
                 fy_token_queue_internal
                           (fyp,(fy_token_list *)&fysk,FYTT_BLOCK_MAPPING_START,&is_multiline);
            if ((fy_token *)handle._48_8_ == (fy_token *)0x0) {
              uStack_190 = 0x143bef;
              fy_parser_diag(fyp,4,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                             ,0x82e,"fy_fetch_value","fy_token_queue_internal() failed");
              goto LAB_00143f9d;
            }
          }
          if ((((byte)rc & 1) != 0) || (pfVar6 = (fy_atom *)&local_188, (local_d5 & 1) != 0)) {
            pfVar5 = (fy_atom *)local_1c8;
            local_178 = fyp;
            pfVar6 = fy_fill_atom(fyp,0,pfVar5);
            handle._48_8_ =
                 fy_token_queue_internal(local_178,(fy_token_list *)&fysk,FYTT_KEY,pfVar6);
            pfVar6 = pfVar5;
            if ((fy_token *)handle._48_8_ == (fy_token *)0x0) {
              fy_parser_diag(fyp,4,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                             ,0x835,"fy_fetch_value","fy_token_queue_internal() failed");
              goto LAB_00143f9d;
            }
          }
          *(undefined8 *)&pfVar6[-1].increment = 0x143c9e;
          fyp_debug_dump_token(fyp,fyt,"insert-token: ");
          *(undefined8 *)&pfVar6[-1].increment = 0x143cc0;
          fyp_debug_dump_token_list(fyp,&fyp->queued_tokens,fyt,"fyp->queued_tokens (before): ");
          *(undefined8 *)&pfVar6[-1].increment = 0x143cd8;
          fyp_debug_dump_token_list(fyp,(fy_token_list *)&fysk,(fy_token *)0x0,"sk_tl: ");
          if (fyt == (fy_token *)0x0) {
            *(undefined8 *)&pfVar6[-1].increment = 0x143d37;
            fy_token_lists_splice(&fyp->queued_tokens,(fy_token_list *)&fysk);
          }
          else if (mark._8_8_ == 0) {
            *(undefined8 *)&pfVar6[-1].increment = 0x143d21;
            fy_token_list_splice_after(&fyp->queued_tokens,fyt,(fy_token_list *)&fysk);
          }
          else {
            *(undefined8 *)&pfVar6[-1].increment = 0x143d04;
            fy_token_list_splice_before(&fyp->queued_tokens,fyt,(fy_token_list *)&fysk);
          }
          *(undefined8 *)&pfVar6[-1].increment = 0x143d59;
          fyp_debug_dump_token_list(fyp,&fyp->queued_tokens,fyt,"fyp->queued_tokens (after): ");
          if (mark._8_8_ == 0) {
            local_17c = (uint)((fyp->flow_level != 0 ^ 0xffU) & 1);
          }
          else {
            local_17c = 0;
          }
          rc._3_1_ = local_17c != 0;
          pfVar5 = (fy_atom *)&pfVar6[-2].increment;
          pfVar6[-2].fyi = (fy_input *)0x143db3;
          local_188 = fyp;
          pfVar7 = fy_fill_atom(fyp,1,pfVar5);
          pfVar6[-2].fyi = (fy_input *)0x143dc9;
          handle._48_8_ = fy_token_queue(local_188,FYTT_VALUE,pfVar7);
          if ((fy_token *)handle._48_8_ != (fy_token *)0x0) {
            *(ushort *)&fyp->field_0x70 =
                 *(ushort *)&fyp->field_0x70 & 0xfff7 | (ushort)(rc._3_1_ & 1) << 3;
            pcVar8 = "false";
            if ((*(ushort *)&fyp->field_0x70 >> 3 & 1) != 0) {
              pcVar8 = "true";
            }
            pfVar6[-2].storage_hint = (size_t)pcVar8;
            pfVar6[-2].end_mark.line = 0x143e8a;
            pfVar6[-2].end_mark.column = 0;
            fy_parser_diag(fyp,0x20,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                           ,0x84f,"fy_fetch_value","simple_key_allowed -> %s\n");
            if (mark._8_8_ != 0) {
              pfVar6[-2].fyi = (fy_input *)0x143ea2;
              fy_parse_simple_key_recycle(fyp,(fy_simple_key *)mark._8_8_);
            }
            if (bVar2 != false) {
              fyp->pending_complex_key_column = -1;
              *(int *)&pfVar6[-2].storage_hint = fyp->pending_complex_key_column;
              pfVar6[-2].end_mark.line = 0x143eee;
              pfVar6[-2].end_mark.column = 0;
              fy_parser_diag(fyp,0x20,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                             ,0x857,"fy_fetch_value","pending_complex_key_column -> %d");
            }
            if (fyt != (fy_token *)0x0) {
              while( true ) {
                pfVar6[-2].fyi = (fy_input *)0x143f0b;
                sk_tl._lh.prev._4_4_ = fy_parse_peek(fyp);
                pfVar6[-2].fyi = (fy_input *)0x143f15;
                _Var3 = fy_is_blank(sk_tl._lh.prev._4_4_);
                if (!_Var3) break;
                pfVar6[-2].fyi = (fy_input *)0x143f27;
                fy_advance(fyp,sk_tl._lh.prev._4_4_);
              }
              if (sk_tl._lh.prev._4_4_ == 0x23) {
                pfVar6[-2].fyi = (fy_input *)0x143f49;
                _drc.override_column = fy_scan_comment(fyp,fyt->comment + 1,false);
                if (_drc.override_column != 0) {
                  pfVar6[-2].fyi = (fy_input *)0x143f82;
                  fy_parser_diag(fyp,4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                                 ,0x863,"fy_fetch_value","fy_scan_comment() failed");
                  goto LAB_00143f9d;
                }
              }
            }
            return 0;
          }
          pfVar6[-2].fyi = (fy_input *)0x143e04;
          fy_parser_diag(fyp,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                         ,0x84c,"fy_fetch_value","fy_token_queue() failed");
          goto LAB_00143f9d;
        }
        _drc_2.fyt = (fy_token *)0x0;
        _drc_2.has_override = false;
        _drc_2._17_7_ = 0;
        _drc_2.type = FYET_DEBUG;
        _drc_2.module = FYEM_UNKNOWN;
        _drc_2.override_file = (char *)0x0;
        auStack_168._0_4_ = FYET_ERROR;
        auStack_168._4_4_ = FYEM_SCAN;
        pfVar5 = fy_fill_atom_at(fyp,0,1,(fy_atom *)local_1c8);
        _drc_2._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar5);
        fy_parser_diag_report
                  (fyp,(fy_diag_report_ctx *)auStack_168,"Illegal placement of \':\' indicator");
      }
      else {
        _drc_1.fyt = (fy_token *)0x0;
        _drc_1.has_override = false;
        _drc_1._17_7_ = 0;
        _drc_1.type = FYET_DEBUG;
        _drc_1.module = FYEM_UNKNOWN;
        _drc_1.override_file = (char *)0x0;
        auStack_138._0_4_ = FYET_ERROR;
        auStack_138._4_4_ = FYEM_SCAN;
        pfVar6 = (fy_atom *)local_1c8;
        pfVar5 = fy_fill_atom_at(fyp,0,1,pfVar6);
        _drc_1._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar5);
        fy_parser_diag_report
                  (fyp,(fy_diag_report_ctx *)auStack_138,
                   "wrongly indented mapping value in flow mode");
      }
    }
  }
  else {
    uStack_190 = 0x143381;
    fy_parser_diag(fyp,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                   ,0x7d3,"fy_fetch_value","illegal value mark");
  }
  _drc.override_column = -1;
  pfVar5 = pfVar6;
LAB_00143f9d:
  *(undefined8 *)&pfVar5[-1].increment = 0x143faa;
  fy_parse_simple_key_recycle(fyp,(fy_simple_key *)mark._8_8_);
  return _drc.override_column;
}

Assistant:

int fy_fetch_value(struct fy_parser *fyp, int c) {
    struct fy_token_list sk_tl;
    struct fy_simple_key *fysk = NULL;
    struct fy_mark mark, mark_insert, mark_end_insert;
    struct fy_token *fyt_insert, *fyt;
    struct fy_atom handle;
    bool target_simple_key_allowed, is_complex, has_bmap;
    bool push_bmap_start, push_key_only, did_purge, final_complex_key;
    bool is_multiline __FY_DEBUG_UNUSED__;
    int rc;

    fyp_error_check(fyp, c == ':', err_out,
                    "illegal value mark");

    FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                          !fyp_json_mode(fyp) || fyp->flow == FYFT_MAP, err_out,
                          "JSON considers keys when not in mapping context invalid");

    fy_get_mark(fyp, &mark);

    fy_token_list_init(&sk_tl);

    FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                          !fyp->flow_level || fyp->column > fyp->indent, err_out,
                          "wrongly indented mapping value in flow mode");

    rc = fy_purge_stale_simple_keys(fyp, &did_purge, FYTT_VALUE);
    fyp_error_check(fyp, !rc, err_out_rc,
                    "fy_purge_stale_simple_keys() failed");

    /* get the simple key (if available) for the value */
    fysk = fy_simple_key_list_head(&fyp->simple_keys);
    if (fysk && fysk->flow_level == fyp->flow_level)
        fy_simple_key_list_del(&fyp->simple_keys, fysk);
    else
        fysk = NULL;

    if (!fysk) {
        fyp_scan_debug(fyp, "no simple key flow_level=%d", fyp->flow_level);

        fyt_insert = fy_token_list_tail(&fyp->queued_tokens);
        mark_insert = mark;
        mark_end_insert = mark;
    } else {
        assert(fysk->possible);
        assert(fysk->flow_level == fyp->flow_level);
        fyt_insert = fysk->token;
        mark_insert = fysk->mark;
        mark_end_insert = fysk->end_mark;

        fyp_scan_debug(fyp, "have simple key flow_level=%d", fyp->flow_level);
    }

    fyp_scan_debug(fyp, "flow_level=%d, column=%d parse_indent=%d",
                   fyp->flow_level, mark_insert.column, fyp->indent);

    is_complex = fyp->pending_complex_key_column >= 0;
    final_complex_key = is_complex && (fyp->flow_level || fyp->column <= fyp->pending_complex_key_mark.column);
    is_multiline = mark_end_insert.line < fyp->line;
    has_bmap = fyp->generated_block_map;
    push_bmap_start = (!fyp->flow_level && mark_insert.column > fyp->indent);
    push_key_only = (!is_complex && (fyp->flow_level || has_bmap)) ||
                    (is_complex && !final_complex_key);

    fyp_scan_debug(fyp, "mark_insert.line=%d/%d mark_end_insert.line=%d/%d fyp->line=%d",
                   mark_insert.line, mark_insert.column,
                   mark_end_insert.line, mark_end_insert.column,
                   fyp->line);

    fyp_scan_debug(fyp,
                   "simple_key_allowed=%s is_complex=%s final_complex_key=%s is_multiline=%s has_bmap=%s push_bmap_start=%s push_key_only=%s",
                   fyp->simple_key_allowed ? "true" : "false",
                   is_complex ? "true" : "false",
                   final_complex_key ? "true" : "false",
                   is_multiline ? "true" : "false",
                   has_bmap ? "true" : "false",
                   push_bmap_start ? "true" : "false",
                   push_key_only ? "true" : "false");

    if (!is_complex && is_multiline && (!fyp->flow_level || fyp->flow != FYFT_MAP)) {
        FYP_PARSE_ERROR(fyp, 0, 1, FYEM_SCAN, "Illegal placement of ':' indicator");
        goto err_out;
    }

    if (push_bmap_start) {

        assert(!fyp->flow_level);

        fyp_scan_debug(fyp, "--- parse_roll");

        /* push the new indent level */
        rc = fy_push_indent(fyp, mark_insert.column, true);
        fyp_error_check(fyp, !rc, err_out_rc,
                        "fy_push_indent() failed");

        fy_fill_atom_start(fyp, &handle);
        fy_fill_atom_end(fyp, &handle);

        handle.start_mark = handle.end_mark = mark_insert;

        /* and the block mapping start */
        fyt = fy_token_queue_internal(fyp, &sk_tl, FYTT_BLOCK_MAPPING_START, &handle);
        fyp_error_check(fyp, fyt, err_out_rc,
                        "fy_token_queue_internal() failed");
    }

    if (push_bmap_start || push_key_only) {

        fyt = fy_token_queue_internal(fyp, &sk_tl, FYTT_KEY, fy_fill_atom_a(fyp, 0));
        fyp_error_check(fyp, fyt, err_out_rc,
                        "fy_token_queue_internal() failed");

    }

    fyp_debug_dump_token(fyp, fyt_insert, "insert-token: ");
    fyp_debug_dump_token_list(fyp, &fyp->queued_tokens, fyt_insert, "fyp->queued_tokens (before): ");
    fyp_debug_dump_token_list(fyp, &sk_tl, NULL, "sk_tl: ");

    if (fyt_insert) {

        if (fysk)
            fy_token_list_splice_before(&fyp->queued_tokens, fyt_insert, &sk_tl);
        else
            fy_token_list_splice_after(&fyp->queued_tokens, fyt_insert, &sk_tl);
    } else
        fy_token_lists_splice(&fyp->queued_tokens, &sk_tl);

    fyp_debug_dump_token_list(fyp, &fyp->queued_tokens, fyt_insert, "fyp->queued_tokens (after): ");

    target_simple_key_allowed = fysk ? false : !fyp->flow_level;

    fyt = fy_token_queue(fyp, FYTT_VALUE, fy_fill_atom_a(fyp, 1));
    fyp_error_check(fyp, fyt, err_out_rc,
                    "fy_token_queue() failed");

    fyp->simple_key_allowed = target_simple_key_allowed;
    fyp_scan_debug(fyp, "simple_key_allowed -> %s\n", fyp->simple_key_allowed ? "true" : "false");

    if (fysk)
        fy_parse_simple_key_recycle(fyp, fysk);

    if (final_complex_key) {
        fyp->pending_complex_key_column = -1;
        fyp_scan_debug(fyp, "pending_complex_key_column -> %d",
                       fyp->pending_complex_key_column);
    }

    if (fyt_insert) {
        /* eat whitespace */
        while (fy_is_blank(c = fy_parse_peek(fyp)))
            fy_advance(fyp, c);

        /* comment? */
        if (c == '#') {
            rc = fy_scan_comment(fyp, &fyt_insert->comment[fycp_right], false);
            fyp_error_check(fyp, !rc, err_out_rc,
                            "fy_scan_comment() failed");
        }
    }

    return 0;

    err_out:
    rc = -1;
    err_out_rc:
    fy_parse_simple_key_recycle(fyp, fysk);
    return rc;
}